

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O0

int __thiscall
JetHead::CircularBuffer::waitForFreeSpace(CircularBuffer *this,int threshold,uint32_t msecs)

{
  int iVar1;
  int iVar2;
  bool local_89;
  undefined1 local_60 [8];
  AutoLock lock;
  timespec cur;
  timespec start;
  uint32_t timeout;
  uint32_t msecs_local;
  int threshold_local;
  CircularBuffer *this_local;
  
  TimeUtils::getCurTime((timespec *)&cur.tv_nsec);
  AutoLock::AutoLock((AutoLock *)local_60,&this->mLock);
  length_internal(this);
  start.tv_nsec._4_4_ = msecs;
  while( true ) {
    iVar2 = this->mBufferSize;
    iVar1 = length_internal(this);
    local_89 = false;
    if (iVar2 - iVar1 < threshold) {
      local_89 = Condition::Wait(&this->mFreeCondition,&this->mLock,start.tv_nsec._4_4_);
    }
    if (local_89 == false) break;
    TimeUtils::getCurTime((timespec *)&lock.mLine);
    iVar2 = TimeUtils::getDifference((timespec *)&lock.mLine,(timespec *)&cur.tv_nsec);
    start.tv_nsec._4_4_ = msecs - iVar2;
  }
  iVar2 = this->mBufferSize;
  iVar1 = length_internal(this);
  if (iVar2 - iVar1 < threshold) {
    this_local._4_4_ = 0;
  }
  else {
    iVar2 = this->mBufferSize;
    iVar1 = length_internal(this);
    this_local._4_4_ = iVar2 - iVar1;
  }
  AutoLock::~AutoLock((AutoLock *)local_60);
  return this_local._4_4_;
}

Assistant:

int CircularBuffer::waitForFreeSpace( int threshold, uint32_t msecs )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	uint32_t timeout = msecs;	
	struct timespec start, cur;
	TimeUtils::getCurTime( &start );
	
	LOG( "Wating for data %d cur size %d timeout %d", threshold, length_internal(), msecs );

	AutoLock lock( mLock );
	
	if ( mBufferSize - length_internal() < threshold )
		LOG_INFO( "buffer underflow" );
	
	while ( mBufferSize - length_internal() < threshold && mFreeCondition.Wait( mLock, timeout ) )
	{
		TimeUtils::getCurTime( &cur );
		timeout = msecs - TimeUtils::getDifference( &cur, &start );
		
		LOG( "Wating for data %d cur size %d msecs remaining %d", threshold, length_internal(), timeout );
	}

	if ( mBufferSize - length_internal() >= threshold )
		return mBufferSize - length_internal();
	else
		return 0;
}